

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingBar::~IfcReinforcingBar(IfcReinforcingBar *this,void **vtt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  void *pvVar3;
  pointer pcVar4;
  undefined1 *puVar5;
  
  pvVar3 = *vtt;
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject = pvVar3;
  *(void **)((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[0x3f];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       vtt[0x40];
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x41];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       vtt[0x42];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 = vtt[0x43];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x138 = vtt[0x44];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x148 = vtt[0x45];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.field_0x158 = vtt[0x46];
  *(void **)&(this->super_IfcReinforcingElement).field_0x190 = vtt[0x47];
  pcVar4 = (this->BarSurface).ptr._M_dataplus._M_p;
  paVar1 = &(this->BarSurface).ptr.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->BarRole)._M_dataplus._M_p;
  paVar1 = &(this->BarRole).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar1) {
    operator_delete(pcVar4,paVar1->_M_allocated_capacity + 1);
  }
  pvVar3 = vtt[1];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject = pvVar3;
  *(void **)((long)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
                    super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.
                    field_0x0 + *(long *)((long)pvVar3 + -0x18)) = vtt[0x35];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0x88 =
       vtt[0x36];
  (this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.super_IfcBuildingElement.
  super_IfcElement.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x37];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.super_IfcObject.field_0xd0 =
       vtt[0x38];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.super_IfcProduct.field_0x100 = vtt[0x39];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x138 = vtt[0x3a];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.super_IfcElement.field_0x148 = vtt[0x3b];
  *(void **)&(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.
             super_IfcBuildingElement.field_0x158 = vtt[0x3c];
  puVar5 = *(undefined1 **)
            &(this->super_IfcReinforcingElement).super_IfcBuildingElementComponent.field_0x168;
  puVar2 = &(this->super_IfcReinforcingElement).field_0x178;
  if (puVar5 != puVar2) {
    operator_delete(puVar5,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,vtt + 4);
  return;
}

Assistant:

IfcReinforcingBar() : Object("IfcReinforcingBar") {}